

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall
World::Command(World *this,string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *arguments,Command_Source *from)

{
  System_Command_Source *this_00;
  string sStack_48;
  
  if (from == (Command_Source *)0x0) {
    this_00 = (System_Command_Source *)operator_new(0x10);
    System_Command_Source::System_Command_Source(this_00,this);
    from = (Command_Source *)this_00;
  }
  else {
    this_00 = (System_Command_Source *)0x0;
  }
  util::lowercase(&sStack_48,command);
  Commands::Handle(&sStack_48,arguments,from);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (this_00 != (System_Command_Source *)0x0) {
    (*(this_00->super_Command_Source)._vptr_Command_Source[8])(this_00);
  }
  return;
}

Assistant:

void World::Command(std::string command, const std::vector<std::string>& arguments, Command_Source* from)
{
	std::unique_ptr<System_Command_Source> system_source;

	if (!from)
	{
		system_source.reset(new System_Command_Source(this));
		from = system_source.get();
	}

	Commands::Handle(util::lowercase(command), arguments, from);
}